

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recvstate.c
# Opt level: O1

int quicly_recvstate_update
              (quicly_recvstate_t *state,uint64_t off,size_t *len,int is_fin,size_t max_ranges)

{
  size_t sVar1;
  ulong uVar2;
  quicly_range_t *pqVar3;
  quicly_range_t *__ptr;
  int iVar4;
  size_t sVar5;
  uint64_t uVar6;
  
  sVar5 = (state->received).num_ranges;
  if (sVar5 == 0) {
    __assert_fail("!quicly_recvstate_transfer_complete(state)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/recvstate.c"
                  ,0x30,
                  "int quicly_recvstate_update(quicly_recvstate_t *, uint64_t, size_t *, int, size_t)"
                 );
  }
  if (state->eos == 0xffffffffffffffff) {
    if ((is_fin != 0) &&
       (sVar1 = *len, state->eos = sVar1 + off,
       sVar1 + off < (state->received).ranges[sVar5 - 1].end)) {
      return 0x20006;
    }
  }
  else if (state->eos < *len + off) {
    return 0x20006;
  }
  uVar2 = state->data_off;
  sVar5 = (*len + off) - uVar2;
  if (*len + off < uVar2 || sVar5 == 0) {
    *len = 0;
    uVar6 = ((state->received).ranges)->end;
  }
  else {
    if (off < uVar2) {
      *len = sVar5;
      off = uVar2;
    }
    if (*len != 0) {
      iVar4 = quicly_ranges_add(&state->received,off,*len + off);
      if (iVar4 != 0) {
        return iVar4;
      }
      if (max_ranges < (state->received).num_ranges) {
        return 0xff07;
      }
    }
    if ((state->received).num_ranges != 1) {
      return 0;
    }
    pqVar3 = (state->received).ranges;
    if (pqVar3->start != 0) {
      return 0;
    }
    uVar6 = pqVar3->end;
  }
  if (uVar6 == state->eos) {
    __ptr = (state->received).ranges;
    pqVar3 = &(state->received)._initial;
    if (__ptr != pqVar3) {
      free(__ptr);
      (state->received).ranges = pqVar3;
    }
    (state->received).num_ranges = 0;
    (state->received).capacity = 1;
  }
  return 0;
}

Assistant:

int quicly_recvstate_update(quicly_recvstate_t *state, uint64_t off, size_t *len, int is_fin, size_t max_ranges)
{
    int ret;

    assert(!quicly_recvstate_transfer_complete(state));

    /* eos handling */
    if (state->eos == UINT64_MAX) {
        if (is_fin) {
            state->eos = off + *len;
            if (state->eos < state->received.ranges[state->received.num_ranges - 1].end)
                return QUICLY_TRANSPORT_ERROR_FINAL_SIZE;
        }
    } else {
        if (off + *len > state->eos)
            return QUICLY_TRANSPORT_ERROR_FINAL_SIZE;
    }

    /* no state change; entire data has already been received */
    if (off + *len <= state->data_off) {
        *len = 0;
        if (state->received.ranges[0].end == state->eos)
            goto Complete;
        return 0;
    }

    /* adjust if partially received */
    if (off < state->data_off) {
        size_t delta = state->data_off - off;
        off += delta;
        *len -= delta;
    }

    /* update received range */
    if (*len != 0) {
        if ((ret = quicly_ranges_add(&state->received, off, off + *len)) != 0)
            return ret;
        if (state->received.num_ranges > max_ranges)
            return QUICLY_ERROR_STATE_EXHAUSTION;
    }
    if (state->received.num_ranges == 1 && state->received.ranges[0].start == 0 && state->received.ranges[0].end == state->eos)
        goto Complete;

    return 0;

Complete:
    quicly_ranges_clear(&state->received);
    return 0;
}